

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyTypeObject * pybind11::detail::make_default_metaclass(void)

{
  int iVar1;
  _object *ptr;
  PyTypeObject *ptr_00;
  handle *this;
  PyObject *pPVar2;
  handle *this_00;
  PyTypeObject *pPVar3;
  PyTypeObject *type;
  PyHeapTypeObject *heap_type;
  object name_obj;
  char *name;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  handle in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  handle in_stack_ffffffffffffffc0;
  handle local_18 [2];
  char *local_8;
  
  local_8 = "pybind11_type";
  ptr = (_object *)PyUnicode_FromString();
  handle::handle<_object_*,_0>(local_18,ptr);
  reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff98);
  ptr_00 = (PyTypeObject *)(*_PyProperty_Type)(&PyType_Type,0);
  if (ptr_00 == (PyTypeObject *)0x0) {
    pybind11_fail(in_stack_ffffffffffffffa0);
  }
  this = handle::inc_ref((handle *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  pPVar2 = handle::ptr(this);
  ptr_00[2].tp_basicsize = (Py_ssize_t)pPVar2;
  this_00 = handle::inc_ref((handle *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
  ;
  pPVar2 = handle::ptr(this_00);
  ptr_00[2].tp_dealloc = (destructor)pPVar2;
  ptr_00->tp_name = "pybind11_type";
  pPVar3 = type_incref((PyTypeObject *)0x10cf79);
  ptr_00->tp_base = pPVar3;
  ptr_00->tp_flags = 0x600;
  ptr_00->tp_call = pybind11_meta_call;
  ptr_00->tp_setattro = pybind11_meta_setattro;
  ptr_00->tp_getattro = pybind11_meta_getattro;
  ptr_00->tp_dealloc = pybind11_meta_dealloc;
  iVar1 = PyType_Ready(ptr_00);
  if (iVar1 < 0) {
    pybind11_fail((char *)this);
  }
  handle::handle<_object_*,_0>((handle *)&stack0xffffffffffffffc0,(_object *)ptr_00);
  str::str((str *)in_stack_ffffffffffffffc0.m_ptr,in_stack_ffffffffffffffb8);
  setattr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,(handle)in_stack_ffffffffffffffb0);
  str::~str((str *)0x10d058);
  object::~object((object *)0x10d06b);
  return ptr_00;
}

Assistant:

inline PyTypeObject *make_default_metaclass() {
    constexpr auto *name = "pybind11_type";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type) {
        pybind11_fail("make_default_metaclass(): error allocating metaclass!");
    }

    heap_type->ht_name = name_obj.inc_ref().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto *type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyType_Type);
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_call = pybind11_meta_call;

    type->tp_setattro = pybind11_meta_setattro;
    type->tp_getattro = pybind11_meta_getattro;

    type->tp_dealloc = pybind11_meta_dealloc;

    if (PyType_Ready(type) < 0) {
        pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");
    }

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    return type;
}